

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

any __thiscall
cs_impl::any::
make_protect<cs::callable,cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&),cs::callable::types>
          (any *this,_func_any_vector<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *args,
          types *args_1)

{
  types tVar1;
  baseHolder *pbVar2;
  proxy *ppVar3;
  
  if ((DAT_0025ded8 == 0) || (cs::global_thread_counter != 0)) {
    pbVar2 = (baseHolder *)operator_new(0x30);
  }
  else {
    pbVar2 = *(baseHolder **)(&holder<bool>::allocator + DAT_0025ded8 * 8);
    DAT_0025ded8 = DAT_0025ded8 + -1;
  }
  pbVar2->_vptr_baseHolder = (_func_int **)&PTR__holder_00254520;
  tVar1 = *args_1;
  pbVar2[1]._vptr_baseHolder = (_func_int **)0x0;
  pbVar2[2]._vptr_baseHolder = (_func_int **)0x0;
  pbVar2[4]._vptr_baseHolder =
       (_func_int **)
       std::
       _Function_handler<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs_impl::any_(*)(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
       ::_M_invoke;
  pbVar2[1]._vptr_baseHolder = (_func_int **)args;
  pbVar2[2]._vptr_baseHolder = (_func_int **)0x0;
  pbVar2[3]._vptr_baseHolder =
       (_func_int **)
       std::
       _Function_handler<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs_impl::any_(*)(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
       ::_M_manager;
  *(types *)&pbVar2[5]._vptr_baseHolder = tVar1;
  if ((DAT_0025fe20 == 0) || (cs::global_thread_counter != 0)) {
    ppVar3 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar3 = (proxy *)(&cs::null_pointer)[DAT_0025fe20];
    DAT_0025fe20 = DAT_0025fe20 + -1;
  }
  ppVar3->is_rvalue = false;
  ppVar3->protect_level = 1;
  ppVar3->refcount = 1;
  ppVar3->data = pbVar2;
  this->mDat = ppVar3;
  return (any)(proxy *)this;
}

Assistant:

static any make_protect(ArgsT &&...args)
		{
			return any(allocator.alloc(1, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}